

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  ulong uVar1;
  cmFunctionBlocker *pcVar2;
  pointer ppcVar3;
  ostream *poVar4;
  pointer puVar5;
  ostringstream e;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ppcVar3 = (this->FunctionBlockers).
            super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar5 = (this->FunctionBlockerBarriers).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar1 = puVar5[-1];
  if (uVar1 < (ulong)((long)ppcVar3 -
                      (long)(this->FunctionBlockers).
                            super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    do {
      pcVar2 = ppcVar3[-1];
      (this->FunctionBlockers).
      super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar3 + -1;
      if ((reportError & 1U) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar4 = operator<<((ostream *)local_1a8,&pcVar2->StartingContext);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"is not closed.",0xe);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (pcVar2 != (cmFunctionBlocker *)0x0) {
        (*pcVar2->_vptr_cmFunctionBlocker[3])(pcVar2);
      }
      ppcVar3 = (this->FunctionBlockers).
                super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      reportError = false;
    } while (uVar1 < (ulong)((long)ppcVar3 -
                             (long)(this->FunctionBlockers).
                                   super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    puVar5 = (this->FunctionBlockerBarriers).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar5 + -1;
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while (this->FunctionBlockers.size() > barrier) {
    CM_AUTO_PTR<cmFunctionBlocker> fb(this->FunctionBlockers.back());
    this->FunctionBlockers.pop_back();
    if (reportError) {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      /* clang-format off */
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      /* clang-format on */
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      reportError = false;
    }
  }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}